

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_dtor.cpp
# Opt level: O2

int main(void)

{
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  A *value_00;
  int value;
  int local_9c;
  A a;
  signal<void_()> signal;
  
  obs::signal<void_()>::signal(&signal,in_ESI,in_RDX);
  value = 0;
  A::A(&a,&signal,&value);
  local_9c = 0;
  expect_eq<int,int>(&value,&local_9c,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1c);
  obs::signal<void_()>::operator()<>(&signal);
  local_9c = 1;
  expect_eq<int,int>(&value,&local_9c,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1e);
  obs::scoped_connection::~scoped_connection(&a.m_conn);
  obs::signal<void_()>::operator()<>(&signal);
  value_00 = &a;
  a.m_conn.m_conn.m_signal._0_4_ = 1;
  expect_eq<int,int>(&value,(int *)value_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x21);
  obs::signal<void_()>::~signal(&signal,(int)value_00,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  int value = 0;
  {
    A a(signal, value);
    EXPECT_EQ(value, 0);
    signal();
    EXPECT_EQ(value, 1);
  }
  signal();
  EXPECT_EQ(value, 1);
}